

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

Node * FindNode(Node *root,string *name)

{
  __type _Var1;
  bool bVar2;
  reference ppNVar3;
  Node *pNVar4;
  Node *nd;
  __normal_iterator<Assimp::D3DS::Node_**,_std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>_>
  local_28;
  iterator it;
  string *name_local;
  Node *root_local;
  
  it._M_current = (Node **)name;
  _Var1 = std::operator==(&root->mName,name);
  root_local = root;
  if (!_Var1) {
    local_28._M_current =
         (Node **)std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::begin
                            (&root->mChildren);
    while( true ) {
      nd = (Node *)std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::end
                             (&root->mChildren);
      bVar2 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<Assimp::D3DS::Node_**,_std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>_>
                          *)&nd);
      if (!bVar2) break;
      ppNVar3 = __gnu_cxx::
                __normal_iterator<Assimp::D3DS::Node_**,_std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>_>
                ::operator*(&local_28);
      pNVar4 = FindNode(*ppNVar3,(string *)it._M_current);
      if (pNVar4 != (Node *)0x0) {
        return pNVar4;
      }
      __gnu_cxx::
      __normal_iterator<Assimp::D3DS::Node_**,_std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>_>
      ::operator++(&local_28);
    }
    root_local = (Node *)0x0;
  }
  return root_local;
}

Assistant:

D3DS::Node* FindNode(D3DS::Node* root, const std::string& name)
{
    if (root->mName == name)
        return root;
    for (std::vector<D3DS::Node*>::iterator it = root->mChildren.begin();it != root->mChildren.end(); ++it) {
        D3DS::Node* nd;
        if (( nd = FindNode(*it,name)))
            return nd;
    }
    return NULL;
}